

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O3

char * match(MatchState *ms,char *s,char *p)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  byte *pbVar6;
  ulong uVar7;
  ptrdiff_t *ppVar8;
  byte *pbVar9;
  byte *pbVar10;
  bool bVar11;
  
  iVar3 = ms->depth;
  ms->depth = iVar3 + 1;
  if (199 < iVar3) {
    lj_err_caller(ms->L,LJ_ERR_STRPATX);
  }
  pbVar10 = (byte *)0x0;
LAB_00120736:
  pbVar5 = (byte *)p;
  do {
    while( true ) {
      bVar1 = *pbVar5;
      pbVar6 = pbVar10;
      if (bVar1 != 0x25) {
        if (bVar1 < 0x28) {
          pbVar6 = (byte *)s;
          if (bVar1 != 0) {
            if ((bVar1 != 0x24) || (pbVar5[1] != 0)) goto LAB_00120804;
            pbVar6 = (byte *)0x0;
            if (s == ms->src_end) {
              pbVar6 = (byte *)s;
            }
          }
        }
        else {
          if (bVar1 == 0x29) {
            uVar7 = (ulong)(uint)ms->level;
            ppVar8 = &ms->capture[uVar7 - 1].len;
            do {
              if ((int)uVar7 < 1) {
                lj_err_caller(ms->L,LJ_ERR_STRPATC);
              }
              uVar7 = uVar7 - 1;
              lVar2 = *ppVar8;
              ppVar8 = ppVar8 + -2;
            } while (lVar2 != -1);
            uVar7 = uVar7 & 0xffffffff;
            ms->capture[uVar7].len = (long)s - (long)ms->capture[uVar7].init;
            pbVar6 = (byte *)match(ms,s,(char *)(pbVar5 + 1));
            if (pbVar6 != (byte *)0x0) goto LAB_00120a12;
            ms->capture[uVar7].len = -1;
            goto LAB_001209d8;
          }
          if (bVar1 != 0x28) goto LAB_00120804;
          if (pbVar5[1] == 0x29) {
            pbVar5 = pbVar5 + 2;
            iVar3 = -2;
          }
          else {
            pbVar5 = pbVar5 + 1;
            iVar3 = -1;
          }
          pbVar6 = (byte *)start_capture(ms,s,(char *)pbVar5,iVar3);
        }
        goto LAB_00120a12;
      }
      bVar1 = pbVar5[1];
      if ((ulong)bVar1 != 0x66) break;
      if (pbVar5[2] != 0x5b) {
        lj_err_caller(ms->L,LJ_ERR_STRPATB);
      }
      pbVar9 = pbVar5 + 2;
      pbVar5 = (byte *)classend(ms,(char *)pbVar9);
      if (s == ms->src_init) {
        uVar4 = 0;
      }
      else {
        uVar4 = (uint)((byte *)s)[-1];
      }
      iVar3 = matchbracketclass(uVar4,(char *)pbVar9,(char *)(pbVar5 + -1));
      pbVar6 = (byte *)0x0;
      if ((iVar3 != 0) ||
         (iVar3 = matchbracketclass((uint)(byte)*s,(char *)pbVar9,(char *)(pbVar5 + -1)), iVar3 == 0
         )) goto LAB_00120a12;
    }
    if (bVar1 == 0x62) {
      bVar1 = pbVar5[2];
      if ((bVar1 == 0) || (pbVar5[3] == 0)) {
        lj_err_caller(ms->L,LJ_ERR_STRPATU);
      }
      if (*s != bVar1) goto LAB_00120a12;
      pbVar9 = (byte *)s + 1;
      if (ms->src_end <= pbVar9) goto LAB_00120a12;
      iVar3 = 1;
      break;
    }
    if ((""[(ulong)bVar1 + 1] & 8) != 0) {
      if ((0x30 < bVar1) && (uVar4 = bVar1 - 0x31, (int)uVar4 < ms->level)) {
        uVar7 = ms->capture[uVar4].len;
        if (uVar7 != 0xffffffffffffffff) {
          if ((((ulong)((long)ms->src_end - (long)s) < uVar7) ||
              (iVar3 = bcmp(ms->capture[uVar4].init,s,uVar7), iVar3 != 0)) ||
             ((byte *)s == (byte *)0x0)) goto LAB_00120a12;
          p = (char *)(pbVar5 + 2);
          s = (char *)((byte *)s + uVar7);
          goto LAB_00120736;
        }
      }
      lj_err_caller(ms->L,LJ_ERR_STRCAPI);
    }
LAB_00120804:
    p = classend(ms,(char *)pbVar5);
    if (s < ms->src_end) {
      iVar3 = singlematch((uint)(byte)*s,(char *)pbVar5,p);
      bVar11 = iVar3 != 0;
    }
    else {
      bVar11 = false;
    }
    bVar1 = *p;
    if (bVar1 != 0x3f) goto LAB_001208c6;
    if ((bVar11) &&
       (pbVar6 = (byte *)match(ms,(char *)((byte *)s + 1),(char *)((byte *)p + 1)),
       pbVar6 != (byte *)0x0)) goto LAB_00120a12;
    pbVar5 = (byte *)p + 1;
  } while( true );
LAB_0012089e:
  if (*pbVar9 == pbVar5[3]) {
    iVar3 = iVar3 + -1;
    if (iVar3 == 0) goto LAB_001208f3;
  }
  else {
    iVar3 = iVar3 + (uint)(*pbVar9 == bVar1);
  }
  pbVar9 = pbVar9 + 1;
  if (pbVar9 == (byte *)ms->src_end) goto LAB_00120a12;
  goto LAB_0012089e;
LAB_001208f3:
  p = (char *)(pbVar5 + 4);
  s = (char *)(pbVar9 + 1);
  goto LAB_00120736;
LAB_001208c6:
  if (bVar1 != 0x2a) {
    if (bVar1 != 0x2b) {
      if (bVar1 == 0x2d) {
        pbVar6 = (byte *)match(ms,s,(char *)((byte *)p + 1));
        if (pbVar6 == (byte *)0x0) goto LAB_00120a6e;
        goto LAB_00120a12;
      }
      s = (char *)((byte *)s + 1);
      pbVar6 = pbVar10;
      if (!bVar11) goto LAB_00120a12;
      goto LAB_00120736;
    }
    if (!bVar11) goto LAB_001209d8;
    s = (char *)((byte *)s + 1);
  }
  pbVar6 = (byte *)max_expand(ms,s,(char *)pbVar5,p);
  goto LAB_00120a12;
LAB_001209d8:
  pbVar6 = (byte *)0x0;
  goto LAB_00120a12;
  while( true ) {
    s = (char *)((byte *)s + 1);
    pbVar6 = (byte *)match(ms,s,(char *)((byte *)p + 1));
    if (pbVar6 != (byte *)0x0) break;
LAB_00120a6e:
    if ((ms->src_end <= s) || (iVar3 = singlematch((uint)(byte)*s,(char *)pbVar5,p), iVar3 == 0))
    goto LAB_001209d8;
  }
LAB_00120a12:
  ms->depth = ms->depth + -1;
  return (char *)pbVar6;
}

Assistant:

static const char *match(MatchState *ms, const char *s, const char *p)
{
  if (++ms->depth > LJ_MAX_XLEVEL)
    lj_err_caller(ms->L, LJ_ERR_STRPATX);
  init: /* using goto's to optimize tail recursion */
  switch (*p) {
  case '(':  /* start capture */
    if (*(p+1) == ')')  /* position capture? */
      s = start_capture(ms, s, p+2, CAP_POSITION);
    else
      s = start_capture(ms, s, p+1, CAP_UNFINISHED);
    break;
  case ')':  /* end capture */
    s = end_capture(ms, s, p+1);
    break;
  case L_ESC:
    switch (*(p+1)) {
    case 'b':  /* balanced string? */
      s = matchbalance(ms, s, p+2);
      if (s == NULL) break;
      p+=4;
      goto init;  /* else s = match(ms, s, p+4); */
    case 'f': {  /* frontier? */
      const char *ep; char previous;
      p += 2;
      if (*p != '[')
	lj_err_caller(ms->L, LJ_ERR_STRPATB);
      ep = classend(ms, p);  /* points to what is next */
      previous = (s == ms->src_init) ? '\0' : *(s-1);
      if (matchbracketclass(uchar(previous), p, ep-1) ||
	 !matchbracketclass(uchar(*s), p, ep-1)) { s = NULL; break; }
      p=ep;
      goto init;  /* else s = match(ms, s, ep); */
      }
    default:
      if (lj_char_isdigit(uchar(*(p+1)))) {  /* capture results (%0-%9)? */
	s = match_capture(ms, s, uchar(*(p+1)));
	if (s == NULL) break;
	p+=2;
	goto init;  /* else s = match(ms, s, p+2) */
      }
      goto dflt;  /* case default */
    }
    break;
  case '\0':  /* end of pattern */
    break;  /* match succeeded */
  case '$':
    /* is the `$' the last char in pattern? */
    if (*(p+1) != '\0') goto dflt;
    if (s != ms->src_end) s = NULL;  /* check end of string */
    break;
  default: dflt: {  /* it is a pattern item */
    const char *ep = classend(ms, p);  /* points to what is next */
    int m = s<ms->src_end && singlematch(uchar(*s), p, ep);
    switch (*ep) {
    case '?': {  /* optional */
      const char *res;
      if (m && ((res=match(ms, s+1, ep+1)) != NULL)) {
	s = res;
	break;
      }
      p=ep+1;
      goto init;  /* else s = match(ms, s, ep+1); */
      }
    case '*':  /* 0 or more repetitions */
      s = max_expand(ms, s, p, ep);
      break;
    case '+':  /* 1 or more repetitions */
      s = (m ? max_expand(ms, s+1, p, ep) : NULL);
      break;
    case '-':  /* 0 or more repetitions (minimum) */
      s = min_expand(ms, s, p, ep);
      break;
    default:
      if (m) { s++; p=ep; goto init; }  /* else s = match(ms, s+1, ep); */
      s = NULL;
      break;
    }
    break;
    }
  }
  ms->depth--;
  return s;
}